

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

void __thiscall ON_3fPoint::Transform(ON_3fPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar6 = (double)this->x;
  dVar9 = (double)this->y;
  dVar8 = (double)this->z;
  dVar7 = xform->m_xform[3][2] * dVar8 + xform->m_xform[3][0] * dVar6 + xform->m_xform[3][1] * dVar9
          + xform->m_xform[3][3];
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x58a,"","divide by zero.");
    this->z = NanPoint.z;
    fVar5 = NanPoint.y;
    this->x = NanPoint.x;
    this->y = fVar5;
    return;
  }
  dVar1 = xform->m_xform[2][1];
  dVar2 = xform->m_xform[2][0];
  dVar3 = xform->m_xform[2][2];
  dVar4 = xform->m_xform[2][3];
  auVar10._0_8_ =
       xform->m_xform[0][3] +
       dVar8 * xform->m_xform[0][2] + dVar6 * xform->m_xform[0][0] + dVar9 * xform->m_xform[0][1];
  auVar10._8_8_ =
       xform->m_xform[1][3] +
       dVar8 * xform->m_xform[1][2] + dVar6 * xform->m_xform[1][0] + dVar9 * xform->m_xform[1][1];
  auVar11._8_8_ = dVar7;
  auVar11._0_8_ = dVar7;
  auVar11 = divpd(auVar10,auVar11);
  this->x = (float)auVar11._0_8_;
  this->y = (float)auVar11._8_8_;
  this->z = (float)((dVar3 * dVar8 + dVar2 * dVar6 + dVar1 * dVar9 + dVar4) / dVar7);
  return;
}

Assistant:

void ON_3fPoint::Transform( const ON_Xform& xform )
{
  const double ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3];
  if (0.0 == ww)
  {
    ON_ERROR("divide by zero.");
    *this = ON_3fPoint::NanPoint;
  }
  else
  {
    const double xx = (xform.m_xform[0][0] * x + xform.m_xform[0][1] * y + xform.m_xform[0][2] * z + xform.m_xform[0][3]) / ww;
    const double yy = (xform.m_xform[1][0] * x + xform.m_xform[1][1] * y + xform.m_xform[1][2] * z + xform.m_xform[1][3]) / ww;
    const double zz = (xform.m_xform[2][0] * x + xform.m_xform[2][1] * y + xform.m_xform[2][2] * z + xform.m_xform[2][3]) / ww;
    x = (float)xx;
    y = (float)yy;
    z = (float)zz;
  }
}